

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall CTestGen9Resource_TestMSAA_Test::TestBody(CTestGen9Resource_TestMSAA_Test *this)

{
  __type _Var1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  GMM_MULTI_TILE_ARCH *pGVar7;
  TEST_RESOURCE_TYPE *pTVar8;
  TEST_BPP *pTVar9;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var10;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var11;
  uint32_t *puVar12;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var13;
  ulong ExpectedValue;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint32_t local_1fc;
  long local_1f8;
  uint local_1a8;
  uint32_t ExpectedHeight_2;
  uint32_t ExpectedQPitch_2;
  uint32_t ExpectedPitch_2;
  GMM_RESOURCE_INFO *MCSResourceInfo;
  uint64_t ExpectedHeight_1;
  uint64_t ExpectedQPitch_1;
  uint32_t ExpectedPitch_1;
  uint32_t HeightMultiplier;
  uint32_t WidthMultiplier;
  uint32_t ExpectedHeight;
  uint32_t ExpectedQPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *MSSResourceInfo;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_bool,_int,_int>_> local_160;
  uint32_t k;
  int ArrayIdx;
  int TestDimIdx;
  TEST_BPP TStack_150;
  bool IsRT;
  TEST_RESOURCE_TYPE ResType;
  TEST_BPP Bpp;
  TEST_TILE_TYPE Tiling;
  undefined1 local_140 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  tuple<int,_int,_int,_bool,_int,_int> element;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  *__range1;
  undefined1 local_78 [4];
  int Size;
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  uint32_t ExpectedMCSBpp;
  uint32_t TileSize;
  uint32_t MCSVAlign;
  uint32_t MCSHAlign;
  uint32_t TileDimY;
  uint32_t TileDimX;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t TestArraySize [2];
  uint32_t TestDimensions [4] [2];
  uint32_t MCSTileSize [1] [2];
  CTestGen9Resource_TestMSAA_Test *this_local;
  
  TestArraySize[0] = 0xf;
  TestArraySize[1] = 0x14;
  _VAlign = 0x500000001;
  TileDimX = 0;
  TileDimY = 0;
  MCSHAlign = 0;
  MCSVAlign = 0;
  TileSize = 0;
  ExpectedMCSBpp = 0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ::vector((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
            *)local_78);
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)local_78,4,2,false);
  __end1 = std::
           vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ::begin((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                    *)local_78);
  element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>._16_8_ =
       std::
       vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
       ::end((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
              *)local_78);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
                                     *)&element.
                                        super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
                                        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                                        super__Head_base<1UL,_int,_false>), bVar4) {
    pGVar7 = (GMM_MULTI_TILE_ARCH *)
             __gnu_cxx::
             __normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
             ::operator*(&__end1);
    gmmParams.MultiTileArch = *pGVar7;
    element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>.
    super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int> =
         *(_Tuple_impl<4UL,_int,_int> *)(pGVar7 + 1);
    element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>.
    _8_8_ = pGVar7[2];
    memset(local_140,0,0x80);
    _Bpp = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)_Bpp & 0xffff000000000000);
    gmmParams.Flags.Gpu = _Bpp;
    pTVar8 = (TEST_RESOURCE_TYPE *)
             std::get<0ul,int,int,int,bool,int,int>
                       ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    ResType = *pTVar8;
    pTVar9 = (TEST_BPP *)
             std::get<1ul,int,int,int,bool,int,int>
                       ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    TStack_150 = *pTVar9;
    p_Var10 = std::get<2ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    TestDimIdx = *p_Var10;
    p_Var11 = std::get<3ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    ArrayIdx._3_1_ = *p_Var11 & 1;
    puVar12 = (uint32_t *)
              std::get<4ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    k = *puVar12;
    p_Var13 = std::get<5ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    local_160 = *p_Var13;
    List.
    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1000;
    if (ResType == TEST_RESOURCE_CUBE) {
      List.
      super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10000;
    }
    if (((TestDimIdx == 1) && ((int)ResType < 4)) &&
       (((ArrayIdx._3_1_ & 1) != 0 ||
        ((ResType != TEST_RESOURCE_2D &&
         ((TStack_150 == TEST_BPP_16 || (TStack_150 == TEST_BPP_32)))))))) {
      CTestResource::SetTileFlag((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_140,ResType);
      CTestResource::SetResType((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_140,TestDimIdx);
      CTestResource::SetResGpuFlags
                ((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_140,(bool)(ArrayIdx._3_1_ & 1))
      ;
      CTestResource::SetResArraySize
                ((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_140,(&VAlign)[local_160]);
      gmmParams.ExistingSysMemSize._4_1_ = 1;
      local_140._4_4_ = CTestResource::SetResourceFormat((CTestResource *)this,TStack_150);
      for (MSSResourceInfo._4_4_ = MSAA_2x; MSSResourceInfo._4_4_ < (MSAA_16x|MSAA_2x);
          MSSResourceInfo._4_4_ = MSSResourceInfo._4_4_ + MSAA_2x) {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  ((CTestResource *)this,TStack_150,(bool)(ArrayIdx._3_1_ & 1),ResType,
                   MSSResourceInfo._4_4_,&MCSHAlign,&MCSVAlign,&TileDimX,&TileDimY,
                   (uint32_t *)
                   &List.
                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&TileSize,&ExpectedMCSBpp);
        gmmParams._40_8_ = ZEXT48(TestDimensions[(long)(int)k + -1][0] * MCSHAlign + 1);
        gmmParams.field_6.BaseWidth = TestDimensions[(long)(int)k + -1][1] * MCSVAlign + 1;
        gmmParams.field_6.BaseWidth64._4_4_ = 1;
        _Var1 = std::pow<double,unsigned_int>(2.0,MSSResourceInfo._4_4_);
        gmmParams.Flags.Wa = SUB84((long)_Var1,0);
        gmmParams.Type._1_1_ = gmmParams.Type._1_1_ & 0x7f;
        _ExpectedQPitch =
             (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,local_140);
        if (_ExpectedQPitch != (GMM_RESOURCE_INFO *)0x0) {
          CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,_ExpectedQPitch,TileDimX);
          CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,_ExpectedQPitch,TileDimY);
          if ((ArrayIdx._3_1_ & 1) == 0) {
            CTestResource::GetInterleaveMSSPattern
                      ((CTestResource *)this,MSSResourceInfo._4_4_,&ExpectedPitch_1,
                       (uint32_t *)((long)&ExpectedQPitch_1 + 4),(bool)(ArrayIdx._3_1_ & 1),
                       TStack_150);
            if (ExpectedPitch_1 < 2) {
              local_1f8 = gmmParams._40_8_;
            }
            else {
              local_1f8 = (gmmParams._40_8_ + 1) - (gmmParams._40_8_ + 1 & 1);
            }
            gmmParams._40_8_ = local_1f8;
            uVar3 = gmmParams._40_8_;
            if (ExpectedQPitch_1._4_4_ < 2) {
              local_1fc = gmmParams.field_6.BaseWidth;
            }
            else {
              local_1fc = (gmmParams.field_6.BaseWidth + 1) - (gmmParams.field_6.BaseWidth + 1 & 1);
            }
            gmmParams.field_6.BaseWidth = local_1fc;
            gmmParams.CpTag = (uint32_t)local_1f8;
            iVar15 = gmmParams.CpTag * ExpectedPitch_1;
            iVar5 = TileDimX - 1;
            uVar6 = -TileDimX;
            gmmParams._40_8_ = uVar3;
            dVar2 = pow(2.0,(double)TStack_150);
            iVar15 = MCSHAlign + (iVar5 + iVar15 & uVar6) * (int)(long)dVar2;
            iVar16 = gmmParams.CpTag * ExpectedPitch_1;
            iVar5 = TileDimX - 1;
            uVar6 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            ExpectedQPitch_1._0_4_ =
                 ~((iVar5 + iVar16 & uVar6) * (int)(long)dVar2 + -1 + MCSHAlign & MCSHAlign - 1) +
                 iVar15;
            CTestResource::VerifyResourcePitch<true>
                      ((CTestResource *)this,_ExpectedQPitch,(uint32_t)ExpectedQPitch_1);
            if (ResType != TEST_RESOURCE_1D) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        ((CTestResource *)this,_ExpectedQPitch,
                         (uint32_t)ExpectedQPitch_1 / MCSHAlign);
            }
            ExpectedValue =
                 (ulong)((gmmParams.field_6.BaseWidth * ExpectedQPitch_1._4_4_ + (TileDimY - 1)) -
                        (gmmParams.field_6.BaseWidth * ExpectedQPitch_1._4_4_ + (TileDimY - 1) &
                        TileDimY - 1));
            if (1 < gmmParams.Depth) {
              CTestResource::VerifyResourceQPitch<true>
                        ((CTestResource *)this,_ExpectedQPitch,ExpectedValue);
            }
            CTestResource::VerifyResourceSize<true>
                      ((CTestResource *)this,_ExpectedQPitch,
                       (ulong)(uint32_t)ExpectedQPitch_1 *
                       (ExpectedValue * gmmParams.Depth + (ulong)(MCSVAlign - 1) &
                       ~(ulong)(MCSVAlign - 1)) +
                       (ulong)(List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 1) &
                       ~(ulong)(List.
                                super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 1));
          }
          else {
            ExpectedHeight = 0;
            WidthMultiplier = 0;
            uVar6 = (TileDimX - 1) + gmmParams.CpTag;
            uVar14 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            iVar5 = MCSHAlign + (uVar6 & uVar14) * (int)(long)dVar2;
            uVar6 = (TileDimX - 1) + gmmParams.CpTag;
            uVar14 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            ExpectedHeight =
                 ~((uVar6 & uVar14) * (int)(long)dVar2 + -1 + MCSHAlign & MCSHAlign - 1) + iVar5;
            CTestResource::VerifyResourcePitch<true>
                      ((CTestResource *)this,_ExpectedQPitch,ExpectedHeight);
            if (ResType != TEST_RESOURCE_1D) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        ((CTestResource *)this,_ExpectedQPitch,ExpectedHeight / MCSHAlign);
            }
            WidthMultiplier =
                 (gmmParams.field_6.BaseWidth + (TileDimY - 1)) -
                 (gmmParams.field_6.BaseWidth + (TileDimY - 1) & TileDimY - 1);
            if (1 < gmmParams.Depth) {
              CTestResource::VerifyResourceQPitch<true>
                        ((CTestResource *)this,_ExpectedQPitch,(ulong)WidthMultiplier);
            }
            HeightMultiplier =
                 (MCSVAlign - 1) + WidthMultiplier * (int)gmmParams.Flags.Wa * gmmParams.Depth &
                 -MCSVAlign;
            CTestResource::VerifyResourceSize<true>
                      ((CTestResource *)this,_ExpectedQPitch,
                       (ulong)(List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1 +
                               ExpectedHeight * HeightMultiplier &
                              -List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          }
        }
        if (_ExpectedQPitch != (GMM_RESOURCE_INFO *)0x0) {
          gmmParams.Type._1_1_ = gmmParams.Type._1_1_ | 0x80;
          ResourceInfo = (GMM_RESOURCE_INFO *)
                         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                   (CommonULT::pGmmULTClientContext,local_140);
          CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,TileSize);
          CTestResource::VerifyResourceVAlign<true>
                    ((CTestResource *)this,ResourceInfo,ExpectedMCSBpp);
          uVar6 = ((TileSize - 1) + gmmParams.CpTag & -TileSize) *
                  (int)List.
                       super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x7f & 0xffffff80;
          CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,uVar6);
          CTestResource::VerifyResourcePitchInTiles<true>
                    ((CTestResource *)this,ResourceInfo,uVar6 / 0x80);
          local_1a8 = (gmmParams.field_6.BaseWidth + (ExpectedMCSBpp - 1)) -
                      (gmmParams.field_6.BaseWidth + (ExpectedMCSBpp - 1) & ExpectedMCSBpp - 1);
          if (1 < gmmParams.Depth) {
            local_1a8 = (ExpectedMCSBpp - 1) + gmmParams.field_6.BaseWidth & -ExpectedMCSBpp;
            CTestResource::VerifyResourceQPitch<true>
                      ((CTestResource *)this,ResourceInfo,(ulong)local_1a8);
          }
          CTestResource::VerifyResourceSize<true>
                    ((CTestResource *)this,ResourceInfo,
                     (ulong)(uVar6 * (local_1a8 * gmmParams.Depth + 0x1f & 0xffffffe0)));
          (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                    (CommonULT::pGmmULTClientContext,ResourceInfo);
        }
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,_ExpectedQPitch);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ::~vector((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
             *)local_78);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestMSAA)
{
    //Tile dimensions in Bytes
    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen9: MSAA 16x no MCS for width > 8K
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //  MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[4][2] = {
    //Input dimensions in #Tiles
    {15, 20}, //16 Tiles x 20 <Max Width: Depth MSS crosses Pitch limit beyond this>
    {0, 0},   //1x1x1
    {1, 0},   //2 Tilesx1
    {1, 1},   //2 Tiles x 2
    };

    uint32_t TestArraySize[2] = {1, 5};

    uint32_t HAlign = 0, VAlign = 0, TileDimX = 0, TileDimY = 0;
    uint32_t MCSHAlign = 0, MCSVAlign = 0, TileSize = 0;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, ArraySize
    auto Size = BuildInputIterator(List, 4, 2, false);             // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling >= TEST_TILEYF         //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k <= MSAA_16x; k++)
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64     = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight      = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
            gmmParams.Depth           = 0x1;
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                    if(gmmParams.ArraySize > 1) //Gen9: Qpitch is distance between array slices (not sample slices)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX);
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);
                    }

                    uint64_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint64_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign);
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); // Align in texels, tehn multiply w/ Bpt
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign);
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4))); //MCS Tile is TileY

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all Input types

    //Mip-mapped, MSAA case:
}